

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O2

void telemetry_messenger_destroy_option(char *name,void *value)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  int iVar1;
  char *pcVar2;
  
  if (name == (char *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar2 = "Failed to destroy messenger option (name is NULL)";
      iVar1 = 0x56f;
LAB_0013661b:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                 ,"telemetry_messenger_destroy_option",iVar1,1,pcVar2);
      return;
    }
  }
  else if (value == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar2 = "Failed to destroy messenger option (value is NULL)";
      iVar1 = 0x573;
      goto LAB_0013661b;
    }
  }
  return;
}

Assistant:

static void telemetry_messenger_destroy_option(const char* name, const void* value)
{
    if (name == NULL)
    {
        LogError("Failed to destroy messenger option (name is NULL)");
    }
    else if (value == NULL)
    {
        LogError("Failed to destroy messenger option (value is NULL)");
    }
    else
    {
        // Nothing to be done for the supported options.
    }
}